

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall
iu_MatcherFailure_x_iutest_x_ElementsAre_Test::~iu_MatcherFailure_x_iutest_x_ElementsAre_Test
          (iu_MatcherFailure_x_iutest_x_ElementsAre_Test *this)

{
  iu_MatcherFailure_x_iutest_x_ElementsAre_Test *this_local;
  
  ~iu_MatcherFailure_x_iutest_x_ElementsAre_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(MatcherFailure, ElementsAre)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge"
        , ElementsAre( 'h', 'o', 'G', 'e', '\0')), "ElementsAre(2): G");
    CHECK_FAILURE( IUTEST_ASSERT_THAT(va
        , ElementsAre(Ge(0), Gt(0), Lt(1))), "ElementsAre(2): Lt: 1");
#if IUTEST_HAS_MATCHER_EACH
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gn, Each(
        ElementsAre(Lt(3), Lt(3)))), "Each: ElementsAre: {Lt: 3, Lt: 3}");
#endif
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gc
        , ElementsAre( Ge(0), Gt(0), Ne(0), Eq(0) ) ), "ElementsAre: argument[3] is less than 4");
}